

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jutils.c
# Opt level: O2

void jcopy_sample_rows(JSAMPARRAY input_array,int source_row,JSAMPARRAY output_array,int dest_row,
                      int num_rows,JDIMENSION num_cols)

{
  long lVar1;
  
  lVar1 = 0;
  for (; 0 < num_rows; num_rows = num_rows + -1) {
    memcpy(*(void **)((long)output_array + lVar1 + (long)dest_row * 8),
           *(void **)((long)input_array + lVar1 + (long)source_row * 8),(ulong)num_cols);
    lVar1 = lVar1 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jcopy_sample_rows(JSAMPARRAY input_array, int source_row,
                  JSAMPARRAY output_array, int dest_row, int num_rows,
                  JDIMENSION num_cols)
/* Copy some rows of samples from one place to another.
 * num_rows rows are copied from input_array[source_row++]
 * to output_array[dest_row++]; these areas may overlap for duplication.
 * The source and destination arrays must be at least as wide as num_cols.
 */
{
  register JSAMPROW inptr, outptr;
  register size_t count = (size_t)(num_cols * sizeof(JSAMPLE));
  register int row;

  input_array += source_row;
  output_array += dest_row;

  for (row = num_rows; row > 0; row--) {
    inptr = *input_array++;
    outptr = *output_array++;
    MEMCOPY(outptr, inptr, count);
  }
}